

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O3

int __thiscall SoftSynthMIDIDevice::StreamOut(SoftSynthMIDIDevice *this,MIDIHDR *header)

{
  MIDIHDR *pMVar1;
  MIDIHDR *pMVar2;
  
  header->lpNext = (MIDIHDR *)0x0;
  pMVar1 = this->Events;
  if (this->Events == (MIDIHDR *)0x0) {
    this->Events = header;
    this->NextTickIn = (double)*(uint *)header->lpData * this->SamplesPerTick;
    this->Position = 0;
  }
  else {
    do {
      pMVar2 = pMVar1;
      pMVar1 = pMVar2->lpNext;
    } while (pMVar1 != (MIDIHDR *)0x0);
    pMVar2->lpNext = header;
  }
  return 0;
}

Assistant:

int SoftSynthMIDIDevice::StreamOut(MIDIHDR *header)
{
	header->lpNext = NULL;
	if (Events == NULL)
	{
		Events = header;
		NextTickIn = SamplesPerTick * *(DWORD *)header->lpData;
		Position = 0;
	}
	else
	{
		MIDIHDR **p;

		for (p = &Events; *p != NULL; p = &(*p)->lpNext)
		{ }
		*p = header;
	}
	return 0;
}